

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::TextureWrapCase::init(TextureWrapCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *context;
  ContextInfo *contextInfo;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Archive *archive;
  size_type sVar4;
  Texture2D *pTVar5;
  Texture2D *pTVar6;
  PixelBufferAccess *access;
  Vector<float,_4> local_3c;
  Vector<float,_4> local_2c;
  TextureWrapCase *local_10;
  TextureWrapCase *this_local;
  
  local_10 = this;
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->m_filenames);
  if (bVar1) {
    pTVar5 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D
              (pTVar5,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,this->m_height
              );
    this->m_texture = pTVar5;
    pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar6,0);
    pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,0);
    tcu::Vector<float,_4>::Vector(&local_2c,-0.5,-0.5,-0.5,2.0);
    tcu::Vector<float,_4>::Vector(&local_3c,1.0,1.0,1.0,0.0);
    tcu::fillWithComponentGradients(access,&local_2c,&local_3c);
    uVar3 = (*this->m_texture->_vptr_Texture2D[2])();
    this = (TextureWrapCase *)(ulong)uVar3;
  }
  else {
    context = this->m_renderCtx;
    contextInfo = this->m_renderCtxInfo;
    archive = tcu::TestContext::getArchive((this->super_TestCase).super_TestNode.m_testCtx);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->m_filenames);
    pTVar5 = glu::Texture2D::create(context,contextInfo,archive,(int)sVar4,&this->m_filenames);
    this->m_texture = pTVar5;
    pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
    iVar2 = tcu::Texture2D::getWidth(pTVar6);
    this->m_width = iVar2;
    pTVar6 = glu::Texture2D::getRefTexture(this->m_texture);
    iVar2 = tcu::Texture2D::getHeight(pTVar6);
    this->m_height = iVar2;
  }
  return (int)this;
}

Assistant:

void TextureWrapCase::init (void)
{
	if (!m_filenames.empty())
	{
		DE_ASSERT(m_width == 0 && m_height == 0 && m_format == GL_NONE && m_dataType == GL_NONE);

		m_texture	= glu::Texture2D::create(m_renderCtx, m_renderCtxInfo, m_testCtx.getArchive(), (int)m_filenames.size(), m_filenames);
		m_width		= m_texture->getRefTexture().getWidth();
		m_height	= m_texture->getRefTexture().getHeight();
	}
	else
	{
		m_texture = new Texture2D(m_renderCtx, m_format, m_dataType, m_width, m_height);

		// Fill level 0.
		m_texture->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), tcu::Vec4(-0.5f, -0.5f, -0.5f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f));

		m_texture->upload();
	}
}